

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.cpp
# Opt level: O1

void __thiscall
icu_63::numparse::impl::ArraySeriesMatcher::ArraySeriesMatcher
          (ArraySeriesMatcher *this,MatcherArray *matchers,int32_t matchersLen)

{
  NumberParseMatcher **__src;
  NumberParseMatcher **__dest;
  
  (this->super_SeriesMatcher).super_CompositionMatcher.super_NumberParseMatcher.
  _vptr_NumberParseMatcher = (_func_int **)&PTR__ArraySeriesMatcher_003ad3e0;
  (this->fMatchers).ptr = matchers->ptr;
  (this->fMatchers).capacity = matchers->capacity;
  (this->fMatchers).needToRelease = matchers->needToRelease;
  __src = matchers->stackArray;
  if (matchers->ptr == __src) {
    __dest = (this->fMatchers).stackArray;
    (this->fMatchers).ptr = __dest;
    memcpy(__dest,__src,(long)matchers->capacity << 3);
  }
  else {
    matchers->ptr = __src;
    matchers->capacity = 3;
    matchers->needToRelease = '\0';
  }
  this->fMatchersLen = matchersLen;
  return;
}

Assistant:

ArraySeriesMatcher::ArraySeriesMatcher(MatcherArray& matchers, int32_t matchersLen)
        : fMatchers(std::move(matchers)), fMatchersLen(matchersLen) {
}